

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompressorType::IfcCompressorType(IfcCompressorType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcCompressorType";
  Schema_2x3::IfcFlowMovingDeviceType::IfcFlowMovingDeviceType
            (&this->super_IfcFlowMovingDeviceType,&PTR_construction_vtable_24__0085de78);
  *(undefined8 *)&(this->super_IfcFlowMovingDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x85dcf8;
  *(undefined8 *)&this->field_0x1e0 = 0x85de60;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x85dd20;
  (this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x85dd48;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x85dd70;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x85dd98;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x85ddc0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x85dde8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x85de10;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x85de38;
  *(undefined1 **)&(this->super_IfcFlowMovingDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcCompressorType() : Object("IfcCompressorType") {}